

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O3

int Intp_ManProofTraceOne(Intp_Man_t *p,Sto_Cls_t *pConflict,Sto_Cls_t *pFinal)

{
  lit lVar1;
  Vec_Ptr_t *pVVar2;
  Sto_Cls_t *pSVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  void **ppvVar8;
  long lVar9;
  ulong uVar10;
  lit *plVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  timespec ts;
  timespec local_60;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  iVar5 = clock_gettime(3,&local_60);
  if (iVar5 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  if (p->fProofVerif != 0) {
    uVar12 = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
    if (p->nResLitsAlloc < (int)uVar12) {
      __assert_fail("(int)pConflict->nLits <= p->nResLitsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x1e3,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
    }
    memcpy(p->pResLits,pConflict + 1,(ulong)(uVar12 << 2));
    p->nResLits = *(uint *)&pConflict->field_0x1c >> 3 & 0xffffff;
  }
  if ((*(uint *)&pConflict->field_0x1c & 0x7fffff8) != 0) {
    uVar6 = 0;
    do {
      p->pSeens[*(int *)((long)&pConflict[1].pNext + uVar6 * 4) >> 1] = '\x01';
      uVar6 = uVar6 + 1;
    } while (uVar6 < (*(uint *)&pConflict->field_0x1c >> 3 & 0xffffff));
  }
  local_50 = lVar14;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  p_00->pArray = piVar7;
  if (p->vAntClas->nSize != pFinal->Id - p->nAntStart) {
    __assert_fail("Vec_PtrSize(p->vAntClas) == pFinal->Id - p->nAntStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x1f5,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  Vec_IntPush(p_00,pConflict->Id);
  pVVar2 = p->vAntClas;
  uVar12 = pVVar2->nSize;
  if (uVar12 == pVVar2->nCap) {
    if ((int)uVar12 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar8;
      pVVar2->nCap = 0x10;
    }
    else {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar12 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar2->pArray,(ulong)uVar12 << 4);
      }
      pVVar2->pArray = ppvVar8;
      pVVar2->nCap = uVar12 * 2;
    }
  }
  else {
    ppvVar8 = pVVar2->pArray;
  }
  iVar5 = pVVar2->nSize;
  pVVar2->nSize = iVar5 + 1;
  ppvVar8[iVar5] = p_00;
  if (0 < (long)p->nTrailSize) {
    uVar12 = p->pProofNums[pConflict->Id];
    lVar14 = (long)p->nTrailSize;
    do {
      uVar6 = (ulong)uVar12;
      lVar16 = lVar14 + -1;
      uVar15 = p->pTrail[lVar14 + -1] >> 1;
      if (p->pSeens[(int)uVar15] != '\0') {
        p->pSeens[(int)uVar15] = '\0';
        pSVar3 = p->pReasons[(int)uVar15];
        if (pSVar3 != (Sto_Cls_t *)0x0) {
          if (p->pTrail[lVar16] != *(int *)&pSVar3[1].pNext) {
            __assert_fail("p->pTrail[i] == pReason->pLits[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                          ,0x20b,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)"
                         );
          }
          if ((*(uint *)&pSVar3->field_0x1c & 0x7fffff0) != 0) {
            lVar9 = 9;
            do {
              p->pSeens[*(int *)((long)&pSVar3->pNext + lVar9 * 4) >> 1] = '\x01';
              uVar10 = lVar9 - 7;
              lVar9 = lVar9 + 1;
            } while (uVar10 < (*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff));
          }
          iVar5 = pSVar3->Id;
          if (p->pProofNums[iVar5] < 1) {
            __assert_fail("Intp_ManProofGet(p, pReason) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                          ,0x213,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)"
                         );
          }
          uVar12 = p->Counter + 1;
          p->Counter = uVar12;
          local_40 = lVar14;
          local_38 = lVar16;
          if (p->fProofWrite != 0) {
            fprintf((FILE *)p->pFile,"%d * %d %d 0\n",(ulong)uVar12,uVar6,
                    (ulong)(uint)p->pProofNums[iVar5]);
            uVar12 = p->Counter;
          }
          if (p->fProofVerif != 0) {
            uVar13 = p->nResLits;
            if ((int)uVar13 < 1) {
              uVar6 = 0;
LAB_008f340d:
              if ((uint)uVar6 == uVar13) goto LAB_008f3412;
            }
            else {
              uVar6 = 0;
              do {
                if (p->pResLits[uVar6] >> 1 == uVar15) goto LAB_008f340d;
                uVar6 = uVar6 + 1;
              } while (uVar13 != uVar6);
              uVar6 = (ulong)uVar13;
LAB_008f3412:
              printf("Recording clause %d: Cannot find variable %d in the temporary resolvent.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar15);
            }
            plVar11 = p->pResLits;
            uVar10 = uVar6 & 0xffffffff;
            uVar13 = plVar11[uVar10];
            if ((*(uint *)&pSVar3[1].pNext ^ uVar13) != 1) {
              local_48 = uVar10;
              printf("Recording clause %d: The resolved variable %d is in the wrong polarity.\n",
                     (ulong)(uint)pFinal->Id,(ulong)uVar15);
              plVar11 = p->pResLits;
              uVar13 = plVar11[local_48];
              uVar10 = local_48;
            }
            if ((int)uVar13 >> 1 != uVar15) {
              __assert_fail("lit_var(p->pResLits[v1]) == Var",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                            ,0x230,
                            "int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
            }
            iVar5 = p->nResLits + -1;
            p->nResLits = iVar5;
            if ((int)uVar6 < iVar5) {
              plVar11 = plVar11 + uVar10;
              do {
                *plVar11 = plVar11[1];
                uVar15 = (int)uVar6 + 1;
                uVar6 = (ulong)uVar15;
                plVar11 = plVar11 + 1;
              } while ((int)uVar15 < p->nResLits);
            }
            if ((*(uint *)&pSVar3->field_0x1c & 0x7fffff0) != 0) {
              uVar6 = 1;
              do {
                iVar5 = p->nResLits;
                if ((long)iVar5 < 1) {
                  uVar10 = 0;
LAB_008f34d1:
                  if ((int)uVar10 == iVar5) goto LAB_008f34d5;
                  if (p->pResLits[uVar10 & 0xffffffff] !=
                      *(int *)((long)&pSVar3[1].pNext + uVar6 * 4)) {
                    printf("Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n"
                           ,(ulong)(uint)pFinal->Id);
                  }
                }
                else {
                  uVar10 = 0;
                  do {
                    if ((p->pResLits[uVar10] ^ *(uint *)((long)&pSVar3[1].pNext + uVar6 * 4)) < 2)
                    goto LAB_008f34d1;
                    uVar10 = uVar10 + 1;
                  } while ((long)iVar5 != uVar10);
LAB_008f34d5:
                  if (iVar5 == p->nResLitsAlloc) {
                    printf("Recording clause %d: Ran out of space for intermediate resolvent.\n",
                           (ulong)(uint)pFinal->Id);
                    iVar5 = p->nResLits;
                  }
                  lVar1 = *(lit *)((long)&pSVar3[1].pNext + uVar6 * 4);
                  p->nResLits = iVar5 + 1;
                  p->pResLits[iVar5] = lVar1;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < (*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff));
            }
          }
          lVar14 = (long)p->vAntClas->nSize;
          if (lVar14 < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
          }
          Vec_IntPush((Vec_Int_t *)p->vAntClas->pArray[lVar14 + -1],pSVar3->Id);
          lVar16 = local_38;
          lVar14 = local_40;
        }
      }
      bVar4 = 1 < lVar14;
      lVar14 = lVar16;
    } while (bVar4);
  }
  lVar14 = local_50;
  if (p->fProofVerif != 0) {
    uVar12 = p->nResLits;
    if (0 < (long)(int)uVar12) {
      uVar15 = *(uint *)&pFinal->field_0x1c >> 3 & 0xffffff;
      if (uVar15 == 0) {
LAB_008f35c9:
        printf("Recording clause %d: The final resolvent is wrong.\n",(ulong)(uint)pFinal->Id);
        Intp_ManPrintClause(p,pConflict);
        Intp_ManPrintResolvent(p->pResLits,p->nResLits);
        Intp_ManPrintClause(p,pFinal);
        uVar12 = p->nResLits;
      }
      else {
        lVar16 = 0;
        do {
          uVar6 = 0;
          while (*(int *)((long)&pFinal[1].pNext + uVar6 * 4) != p->pResLits[lVar16]) {
            uVar6 = uVar6 + 1;
            if (uVar15 == uVar6) goto LAB_008f35c9;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != (int)uVar12);
      }
    }
    uVar15 = *(uint *)&pFinal->field_0x1c;
    uVar13 = uVar15 >> 3 & 0xffffff;
    if (uVar12 != uVar13) {
      if (uVar13 == 0) {
        uVar13 = 0;
      }
      else {
        iVar5 = 0;
        do {
          if (0 < (long)p->nResLits) {
            lVar16 = 0;
            do {
              if (*(int *)((long)&pFinal[1].pNext + (long)iVar5 * 4) == p->pResLits[lVar16]) {
                iVar5 = iVar5 + 1;
                goto LAB_008f3696;
              }
              lVar16 = lVar16 + 1;
            } while (p->nResLits != lVar16);
          }
          uVar12 = uVar15 + 0x7fffff8;
          uVar15 = uVar15 & 0xf8000007 | uVar12 & 0x7fffff8;
          *(uint *)&pFinal->field_0x1c = uVar15;
          if (iVar5 < (int)(uVar12 >> 3 & 0xffffff)) {
            lVar16 = (long)iVar5;
            do {
              *(undefined4 *)((long)&pFinal[1].pNext + lVar16 * 4) =
                   *(undefined4 *)((long)&pFinal[1].pNext + lVar16 * 4 + 4);
              lVar16 = lVar16 + 1;
              uVar15 = *(uint *)&pFinal->field_0x1c;
            } while (lVar16 < (long)(ulong)(uVar15 >> 3 & 0xffffff));
          }
LAB_008f3696:
          uVar13 = uVar15 >> 3 & 0xffffff;
        } while (iVar5 < (int)uVar13);
        uVar12 = p->nResLits;
      }
      if (uVar12 != uVar13) {
        __assert_fail("p->nResLits == (int)pFinal->nLits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                      ,0x27f,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
      }
    }
  }
  iVar5 = clock_gettime(3,&local_60);
  if (iVar5 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  p->timeTrace = p->timeTrace + lVar16 + lVar14;
  iVar5 = p->Counter;
  piVar7 = p->pProofNums;
  piVar7[pFinal->Id] = iVar5;
  if (piVar7[(long)pFinal->Id + -1] == iVar5) {
    __assert_fail("p->pProofNums[pFinal->Id-1] != p->Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x28b,"int Intp_ManProofTraceOne(Intp_Man_t *, Sto_Cls_t *, Sto_Cls_t *)");
  }
  return iVar5;
}

Assistant:

int Intp_ManProofTraceOne( Intp_Man_t * p, Sto_Cls_t * pConflict, Sto_Cls_t * pFinal )
{
    Sto_Cls_t * pReason;
    int i, v, Var, PrevId;
    int fPrint = 0;
    abctime clk = Abc_Clock();

    // collect resolvent literals
    if ( p->fProofVerif )
    {
        assert( (int)pConflict->nLits <= p->nResLitsAlloc );
        memcpy( p->pResLits, pConflict->pLits, sizeof(lit) * pConflict->nLits );
        p->nResLits = pConflict->nLits;
    }

    // mark all the variables in the conflict as seen
    for ( v = 0; v < (int)pConflict->nLits; v++ )
        p->pSeens[lit_var(pConflict->pLits[v])] = 1;

    // start the anticedents
//    pFinal->pAntis = Vec_PtrAlloc( 32 );
//    Vec_PtrPush( pFinal->pAntis, pConflict );

//    assert( pFinal->Id == Vec_IntSize(p->vBreaks) );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
//    Vec_IntPush( p->vAnties, pConflict->Id );
    {
        Vec_Int_t * vAnts = Vec_IntAlloc( 16 );
        assert( Vec_PtrSize(p->vAntClas) == pFinal->Id - p->nAntStart );
        Vec_IntPush( vAnts, pConflict->Id );
        Vec_PtrPush( p->vAntClas, vAnts );
    }

//    if ( p->pCnf->nClausesA )
//        Intp_ManAigCopy( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pConflict) );

    // follow the trail backwards
    PrevId = Intp_ManProofGet(p, pConflict);
    for ( i = p->nTrailSize - 1; i >= 0; i-- )
    {
        // skip literals that are not involved
        Var = lit_var(p->pTrail[i]);
        if ( !p->pSeens[Var] )
            continue;
        p->pSeens[Var] = 0;

        // skip literals of the resulting clause
        pReason = p->pReasons[Var];
        if ( pReason == NULL )
            continue;
        assert( p->pTrail[i] == pReason->pLits[0] );

        // add the variables to seen
        for ( v = 1; v < (int)pReason->nLits; v++ )
            p->pSeens[lit_var(pReason->pLits[v])] = 1;


        // record the reason clause
        assert( Intp_ManProofGet(p, pReason) > 0 );
        p->Counter++;
        if ( p->fProofWrite )
            fprintf( p->pFile, "%d * %d %d 0\n", p->Counter, PrevId, Intp_ManProofGet(p, pReason) );
        PrevId = p->Counter;

//        if ( p->pCnf->nClausesA )
//       {
//            if ( p->pVarTypes[Var] == 1 ) // var of A
//                Intp_ManAigOr( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pReason) );
//            else
//                Intp_ManAigAnd( p, Intp_ManAigRead(p, pFinal), Intp_ManAigRead(p, pReason) );
//        }
 
        // resolve the temporary resolvent with the reason clause
        if ( p->fProofVerif )
        {
            int v1, v2; 
            if ( fPrint )
                Intp_ManPrintResolvent( p->pResLits, p->nResLits );
            // check that the var is present in the resolvent
            for ( v1 = 0; v1 < p->nResLits; v1++ )
                if ( lit_var(p->pResLits[v1]) == Var )
                    break;
            if ( v1 == p->nResLits )
                printf( "Recording clause %d: Cannot find variable %d in the temporary resolvent.\n", pFinal->Id, Var );
            if ( p->pResLits[v1] != lit_neg(pReason->pLits[0]) )
                printf( "Recording clause %d: The resolved variable %d is in the wrong polarity.\n", pFinal->Id, Var );
            // remove this variable from the resolvent
            assert( lit_var(p->pResLits[v1]) == Var );
            p->nResLits--;
            for ( ; v1 < p->nResLits; v1++ )
                p->pResLits[v1] = p->pResLits[v1+1];
            // add variables of the reason clause
            for ( v2 = 1; v2 < (int)pReason->nLits; v2++ )
            {
                for ( v1 = 0; v1 < p->nResLits; v1++ )
                    if ( lit_var(p->pResLits[v1]) == lit_var(pReason->pLits[v2]) )
                        break;
                // if it is a new variable, add it to the resolvent
                if ( v1 == p->nResLits ) 
                {
                    if ( p->nResLits == p->nResLitsAlloc )
                        printf( "Recording clause %d: Ran out of space for intermediate resolvent.\n", pFinal->Id );
                    p->pResLits[ p->nResLits++ ] = pReason->pLits[v2];
                    continue;
                }
                // if the variable is the same, the literal should be the same too
                if ( p->pResLits[v1] == pReason->pLits[v2] )
                    continue;
                // the literal is different
                printf( "Recording clause %d: Trying to resolve the clause with more than one opposite literal.\n", pFinal->Id );
            }
        }

//        Vec_PtrPush( pFinal->pAntis, pReason );
//        Vec_IntPush( p->vAnties, pReason->Id );
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntryLast(p->vAntClas), pReason->Id );
    }

    // unmark all seen variables
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        p->pSeens[lit_var(p->pTrail[i])] = 0;
    // check that the literals are unmarked
//    for ( i = p->nTrailSize - 1; i >= 0; i-- )
//        assert( p->pSeens[lit_var(p->pTrail[i])] == 0 );

    // use the resulting clause to check the correctness of resolution
    if ( p->fProofVerif )
    {
        int v1, v2; 
        if ( fPrint )
            Intp_ManPrintResolvent( p->pResLits, p->nResLits );
        for ( v1 = 0; v1 < p->nResLits; v1++ )
        {
            for ( v2 = 0; v2 < (int)pFinal->nLits; v2++ )
                if ( pFinal->pLits[v2] == p->pResLits[v1] )
                    break;
            if ( v2 < (int)pFinal->nLits )
                continue;
            break;
        }
        if ( v1 < p->nResLits )
        {
            printf( "Recording clause %d: The final resolvent is wrong.\n", pFinal->Id );
            Intp_ManPrintClause( p, pConflict );
            Intp_ManPrintResolvent( p->pResLits, p->nResLits );
            Intp_ManPrintClause( p, pFinal );
        }

        // if there are literals in the clause that are not in the resolvent
        // it means that the derived resolvent is stronger than the clause
        // we can replace the clause with the resolvent by removing these literals
        if ( p->nResLits != (int)pFinal->nLits )
        {
            for ( v1 = 0; v1 < (int)pFinal->nLits; v1++ )
            {
                for ( v2 = 0; v2 < p->nResLits; v2++ )
                    if ( pFinal->pLits[v1] == p->pResLits[v2] )
                        break;
                if ( v2 < p->nResLits )
                    continue;
                // remove literal v1 from the final clause
                pFinal->nLits--;
                for ( v2 = v1; v2 < (int)pFinal->nLits; v2++ )
                    pFinal->pLits[v2] = pFinal->pLits[v2+1];
                v1--;
            }
            assert( p->nResLits == (int)pFinal->nLits );
        }
    }
p->timeTrace += Abc_Clock() - clk;

    // return the proof pointer 
//    if ( p->pCnf->nClausesA )
//    {
//        Intp_ManPrintInterOne( p, pFinal );
//    }
    Intp_ManProofSet( p, pFinal, p->Counter );
    // make sure the same proof ID is not asssigned to two consecutive clauses
    assert( p->pProofNums[pFinal->Id-1] != p->Counter );
//    if ( p->pProofNums[pFinal->Id] == p->pProofNums[pFinal->Id-1] )
//        p->pProofNums[pFinal->Id] = p->pProofNums[pConflict->Id];
    return p->Counter;
}